

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::yield()::YieldPromiseNode::get(kj::_::ExceptionOrValue__(void *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::_::Void> *this_00;
  Void local_1b9;
  ExceptionOr<kj::_::Void> local_1b8;
  ExceptionOrValue *local_18;
  ExceptionOrValue *output_local;
  YieldPromiseNode *this_local;
  
  local_18 = output;
  output_local = (ExceptionOrValue *)this;
  kj::_::ExceptionOr<kj::_::Void>::ExceptionOr(&local_1b8,&local_1b9);
  this_00 = kj::_::ExceptionOrValue::as<kj::_::Void>(local_18);
  kj::_::ExceptionOr<kj::_::Void>::operator=(this_00,&local_1b8);
  kj::_::ExceptionOr<kj::_::Void>::~ExceptionOr(&local_1b8);
  return;
}

Assistant:

void get(_::ExceptionOrValue& output) noexcept override {
      output.as<_::Void>() = _::Void();
    }